

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbering.h
# Opt level: O0

Index __thiscall wasm::ValueNumbering::getValue(ValueNumbering *this,Literals *lit)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  _Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true> local_28;
  iterator iter;
  Literals *lit_local;
  ValueNumbering *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Literals,_unsigned_int>,_true>)lit;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Literals,_unsigned_int,_std::hash<wasm::Literals>,_std::equal_to<wasm::Literals>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>_>
       ::find(&this->literalValues,lit);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Literals,_unsigned_int,_std::hash<wasm::Literals>,_std::equal_to<wasm::Literals>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>_>
       ::end(&this->literalValues);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Literals,_unsigned_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_wasm::Literals,_unsigned_int>,_false,_true>
                         *)&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_local._4_4_ = getUniqueValue(this);
    pmVar3 = std::
             unordered_map<wasm::Literals,_unsigned_int,_std::hash<wasm::Literals>,_std::equal_to<wasm::Literals>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>_>
             ::operator[](&this->literalValues,lit);
    *pmVar3 = this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

Index getValue(Literals lit) {
    auto iter = literalValues.find(lit);
    if (iter != literalValues.end()) {
      return iter->second;
    }
    return literalValues[lit] = getUniqueValue();
  }